

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O2

void __thiscall kratos::PassManager::register_builtin_passes(PassManager *this)

{
  string local_38;
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"remove_pass_through_modules",&local_11);
  register_pass(this,&local_38,remove_pass_through_modules);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"transform_if_to_case",&local_11);
  register_pass(this,&local_38,transform_if_to_case);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"fix_assignment_type",&local_11);
  register_pass(this,&local_38,fix_assignment_type);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"zero_out_stubs",&local_11)
  ;
  register_pass(this,&local_38,zero_out_stubs);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"remove_fanout_one_wires",&local_11);
  register_pass(this,&local_38,remove_fanout_one_wires);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"decouple_generator_ports",&local_11);
  register_pass(this,&local_38,decouple_generator_ports);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"remove_unused_vars",&local_11);
  register_pass(this,&local_38,remove_unused_vars);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"remove_unused_stmts",&local_11);
  register_pass(this,&local_38,remove_unused_stmts);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"verify_assignments",&local_11);
  register_pass(this,&local_38,verify_assignments);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"verify_generator_connectivity",&local_11);
  register_pass(this,&local_38,verify_generator_connectivity);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_mixed_assignment",&local_11);
  register_pass(this,&local_38,check_mixed_assignment);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"merge_wire_assignments",&local_11);
  register_pass(this,&local_38,merge_wire_assignments);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"merge_if_block",&local_11)
  ;
  register_pass(this,&local_38,merge_if_block);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"zero_generator_inputs",&local_11);
  register_pass(this,&local_38,zero_generator_inputs);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"change_port_bundle_struct",&local_11);
  register_pass(this,&local_38,change_port_bundle_struct);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"realize_fsm",&local_11);
  register_pass(this,&local_38,realize_fsm);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_function_return",&local_11);
  register_pass(this,&local_38,check_function_return);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"sort_stmts",&local_11);
  register_pass(this,&local_38,sort_stmts);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_active_high",&local_11);
  register_pass(this,&local_38,check_active_high);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_non_synthesizable_content",&local_11);
  register_pass(this,&local_38,check_non_synthesizable_content);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"insert_verilator_public",&local_11);
  register_pass(this,&local_38,insert_verilator_public);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"remove_assertion",&local_11);
  register_pass(this,&local_38,remove_assertion);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_always_sensitivity",&local_11);
  register_pass(this,&local_38,check_always_sensitivity);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_inferred_latch",&local_11);
  register_pass(this,&local_38,check_inferred_latch);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_multiple_driver",&local_11);
  register_pass(this,&local_38,check_multiple_driver);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_combinational_loop",&local_11);
  register_pass(this,&local_38,check_combinational_loop);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"check_flip_flop_always_ff",&local_11);
  register_pass(this,&local_38,check_flip_flop_always_ff);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"propagate_scope_variable",&local_11);
  register_pass(this,&local_38,propagate_scope_variable);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"change_property_into_stmt",&local_11);
  register_pass(this,&local_38,change_property_into_stmt);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"merge_const_port_assignment",&local_11);
  register_pass(this,&local_38,merge_const_port_assignment);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"remove_event_stmts",&local_11);
  register_pass(this,&local_38,remove_event_stmts);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"lift_genvar_instances",&local_11);
  register_pass(this,&local_38,lift_genvar_instances);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"hash_generators_parallel",&local_11);
  register_pass(this,&local_38,hash_generators_parallel);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"hash_generators_sequential",&local_11);
  register_pass(this,&local_38,hash_generators_sequential);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"uniquify_generators",&local_11);
  register_pass(this,&local_38,uniquify_generators);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"create_module_instantiation",&local_11);
  register_pass(this,&local_38,create_module_instantiation);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"create_interface_instantiation",&local_11);
  register_pass(this,&local_38,create_interface_instantiation);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"insert_pipeline_stages",&local_11);
  register_pass(this,&local_38,insert_pipeline_stages);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"auto_insert_clock_enable",&local_11);
  register_pass(this,&local_38,auto_insert_clock_enable);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"auto_insert_sync_reset",&local_11);
  register_pass(this,&local_38,auto_insert_sync_reset);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"ssa_transform_fix",&local_11);
  register_pass(this,&local_38,ssa_transform_fix);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"port_legality_fix",&local_11);
  register_pass(this,&local_38,port_legality_fix);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"dead_code_elimination",&local_11);
  register_pass(this,&local_38,dead_code_elimination);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"inject_assertion_fail",&local_11);
  register_pass(this,&local_38,inject_assertion_fail);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"sort_initial_stmts",&local_11);
  register_pass(this,&local_38,sort_initial_stmts);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"infer_property_clocking",&local_11);
  register_pass(this,&local_38,infer_property_clocking);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"inline_instance",&local_11);
  register_pass(this,&local_38,inline_instance);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void PassManager::register_builtin_passes() {
    register_pass("remove_pass_through_modules", &remove_pass_through_modules);

    register_pass("transform_if_to_case", &transform_if_to_case);

    register_pass("fix_assignment_type", &fix_assignment_type);

    register_pass("zero_out_stubs", &zero_out_stubs);

    register_pass("remove_fanout_one_wires", &remove_fanout_one_wires);

    register_pass("decouple_generator_ports", &decouple_generator_ports);

    register_pass("remove_unused_vars", &remove_unused_vars);

    register_pass("remove_unused_stmts", &remove_unused_stmts);

    register_pass("verify_assignments", &verify_assignments);

    register_pass("verify_generator_connectivity", &verify_generator_connectivity);

    register_pass("check_mixed_assignment", &check_mixed_assignment);

    register_pass("merge_wire_assignments", &merge_wire_assignments);

    register_pass("merge_if_block", &merge_if_block);

    register_pass("zero_generator_inputs", &zero_generator_inputs);

    register_pass("change_port_bundle_struct", &change_port_bundle_struct);

    register_pass("realize_fsm", &realize_fsm);

    register_pass("check_function_return", &check_function_return);

    register_pass("sort_stmts", &sort_stmts);

    register_pass("check_active_high", &check_active_high);

    register_pass("check_non_synthesizable_content", &check_non_synthesizable_content);

    register_pass("insert_verilator_public", &insert_verilator_public);

    register_pass("remove_assertion", &remove_assertion);

    register_pass("check_always_sensitivity", &check_always_sensitivity);

    register_pass("check_inferred_latch", &check_inferred_latch);

    register_pass("check_multiple_driver", &check_multiple_driver);

    register_pass("check_combinational_loop", &check_combinational_loop);

    register_pass("check_flip_flop_always_ff", &check_flip_flop_always_ff);

    register_pass("propagate_scope_variable", &propagate_scope_variable);

    register_pass("change_property_into_stmt", &change_property_into_stmt);

    register_pass("merge_const_port_assignment", &merge_const_port_assignment);

    register_pass("remove_event_stmts", &remove_event_stmts);

    register_pass("lift_genvar_instances", &lift_genvar_instances);

    // TODO:
    //  add inline pass

    register_pass("hash_generators_parallel", &hash_generators_parallel);
    register_pass("hash_generators_sequential", &hash_generators_sequential);

    register_pass("uniquify_generators", &uniquify_generators);

    register_pass("create_module_instantiation", &create_module_instantiation);

    register_pass("create_interface_instantiation", &create_interface_instantiation);

    register_pass("insert_pipeline_stages", &insert_pipeline_stages);

    register_pass("auto_insert_clock_enable", &auto_insert_clock_enable);

    register_pass("auto_insert_sync_reset", &auto_insert_sync_reset);

    register_pass("ssa_transform_fix", &ssa_transform_fix);

    register_pass("port_legality_fix", &port_legality_fix);

    register_pass("dead_code_elimination", &dead_code_elimination);

    register_pass("inject_assertion_fail", &inject_assertion_fail);

    register_pass("sort_initial_stmts", &sort_initial_stmts);

    register_pass("infer_property_clocking", &infer_property_clocking);

    register_pass("inline_instance", &inline_instance);
}